

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O3

mat3x2f * __thiscall Triangle::jacobi(mat3x2f *__return_storage_ptr__,Triangle *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_38 [4];
  undefined8 local_28;
  float local_20 [4];
  
  fVar15 = (this->v1).z;
  uVar1 = (this->v1).x;
  uVar3 = (this->v1).y;
  uVar2 = (this->v2).x;
  local_38[0] = (float)uVar2 - (float)uVar1;
  local_38[1] = (this->v3).x - (float)uVar1;
  local_38[2] = (this->v2).y - (float)uVar3;
  local_38[3] = (this->v3).y - (float)uVar3;
  local_28 = CONCAT44((this->v3).z - fVar15,(this->v2).z - fVar15);
  fVar15 = (this->vt1).x;
  fVar12 = (this->vt1).y;
  fVar13 = (this->vt2).x - fVar15;
  fVar11 = (this->vt2).y - fVar12;
  fVar15 = (this->vt3).x - fVar15;
  fVar12 = (this->vt3).y - fVar12;
  fVar14 = 1.0 / (fVar13 * fVar12 - fVar11 * fVar15);
  local_20[0] = fVar12 * fVar14;
  local_20[1] = -fVar15 * fVar14;
  local_20[2] = -fVar11 * fVar14;
  local_20[3] = fVar13 * fVar14;
  __return_storage_ptr__->data[0] = (float  [2])0x0;
  __return_storage_ptr__->data[1] = (float  [2])0x0;
  __return_storage_ptr__->data[2] = (float  [2])0x0;
  lVar5 = 0;
  do {
    lVar8 = 0;
    pfVar9 = local_20;
    bVar4 = true;
    do {
      bVar7 = bVar4;
      fVar15 = __return_storage_ptr__->data[lVar5][lVar8];
      lVar10 = 0;
      bVar4 = true;
      do {
        bVar6 = bVar4;
        fVar15 = fVar15 + local_38[lVar5 * 2 + lVar10] * pfVar9[lVar10 * 2];
        lVar10 = 1;
        bVar4 = false;
      } while (bVar6);
      __return_storage_ptr__->data[lVar5][lVar8] = fVar15;
      lVar8 = 1;
      pfVar9 = local_20 + 1;
      bVar4 = false;
    } while (bVar7);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  return __return_storage_ptr__;
}

Assistant:

mat3x2f jacobi() const // [dpdu dpdv]
	{
		return mat3x2f(v2-v1, v3-v1) * inverse(mat2f(vt2-vt1, vt3-vt1));
	}